

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O1

int __thiscall
chrono::ChSystemDescriptor::FromVectorToConstraints
          (ChSystemDescriptor *this,ChVectorDynamic<> *mvector)

{
  long lVar1;
  pointer ppCVar2;
  double *pdVar3;
  ChConstraint *pCVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  iVar5 = (*this->_vptr_ChSystemDescriptor[8])();
  this->n_c = iVar5;
  lVar1 = (mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  if (lVar1 != iVar5) {
    __assert_fail("n_c == mvector.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChSystemDescriptor.cpp"
                  ,0x19f,
                  "virtual int chrono::ChSystemDescriptor::FromVectorToConstraints(const ChVectorDynamic<> &)"
                 );
  }
  ppCVar2 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar6 = ((long)(this->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2) * 0x20000000;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 0x20;
    pdVar3 = (mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    lVar7 = 0;
    do {
      pCVar4 = ppCVar2[lVar7];
      if (pCVar4->active == true) {
        lVar8 = (long)pCVar4->offset;
        if ((lVar8 < 0) || (lVar1 <= lVar8)) {
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                       );
        }
        pCVar4->l_i = pdVar3[lVar8];
      }
      lVar7 = lVar7 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
  }
  return iVar5;
}

Assistant:

int ChSystemDescriptor::FromVectorToConstraints(const ChVectorDynamic<>& mvector) {
    n_c = CountActiveConstraints();

    assert(n_c == mvector.size());

    auto vc_size = (int)vconstraints.size();

    // Fill the vector
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            vconstraints[ic]->Set_l_i(mvector(vconstraints[ic]->GetOffset()));
        }
    }

    return n_c;
}